

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall spvtools::val::ValidationState_t::in_block(ValidationState_t *this)

{
  bool bVar1;
  const_reference this_00;
  BasicBlock *pBVar2;
  bool local_11;
  ValidationState_t *this_local;
  
  bVar1 = std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>::empty
                    (&this->module_functions_);
  local_11 = false;
  if (!bVar1) {
    this_00 = std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>::back
                        (&this->module_functions_);
    pBVar2 = val::Function::current_block(this_00);
    local_11 = pBVar2 != (BasicBlock *)0x0;
  }
  return local_11;
}

Assistant:

bool ValidationState_t::in_block() const {
  return module_functions_.empty() == false &&
         module_functions_.back().current_block() != nullptr;
}